

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

void aom_comp_avg_pred_c(uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,
                        int ref_stride)

{
  int tmp;
  int j;
  int i;
  int ref_stride_local;
  uint8_t *ref_local;
  int height_local;
  int width_local;
  uint8_t *pred_local;
  uint8_t *comp_pred_local;
  
  ref_local = ref;
  pred_local = pred;
  comp_pred_local = comp_pred;
  for (i = 0; i < height; i = i + 1) {
    for (j = 0; j < width; j = j + 1) {
      comp_pred_local[j] = (uint8_t)((int)((uint)pred_local[j] + (uint)ref_local[j] + 1) >> 1);
    }
    comp_pred_local = comp_pred_local + width;
    pred_local = pred_local + width;
    ref_local = ref_local + ref_stride;
  }
  return;
}

Assistant:

void aom_comp_avg_pred_c(uint8_t *comp_pred, const uint8_t *pred, int width,
                         int height, const uint8_t *ref, int ref_stride) {
  int i, j;

  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      const int tmp = pred[j] + ref[j];
      comp_pred[j] = ROUND_POWER_OF_TWO(tmp, 1);
    }
    comp_pred += width;
    pred += width;
    ref += ref_stride;
  }
}